

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.h
# Opt level: O0

void __thiscall
wasm::EffectAnalyzer::InternalAnalyzer::visitCallRef(InternalAnalyzer *this,CallRef *curr)

{
  bool bVar1;
  ulong uVar2;
  CallRef *curr_local;
  InternalAnalyzer *this_local;
  
  bVar1 = Type::isNull((Type *)(*(long *)(curr + 0x30) + 8));
  if (bVar1) {
    this->parent->trap = true;
  }
  else {
    this->parent->calls = true;
    bVar1 = FeatureSet::hasExceptionHandling(&this->parent->features);
    if ((bVar1) && (this->parent->tryDepth == 0)) {
      this->parent->throws_ = true;
    }
    if (((byte)curr[0x38] & 1) != 0) {
      this->parent->branchesOut = true;
    }
    uVar2 = ::wasm::Type::isNullable();
    if ((uVar2 & 1) != 0) {
      this->parent->implicitTrap = true;
    }
  }
  return;
}

Assistant:

void visitCallRef(CallRef* curr) {
      if (curr->target->type.isNull()) {
        parent.trap = true;
        return;
      }
      parent.calls = true;
      if (parent.features.hasExceptionHandling() && parent.tryDepth == 0) {
        parent.throws_ = true;
      }
      if (curr->isReturn) {
        parent.branchesOut = true;
      }
      // traps when the call target is null
      if (curr->target->type.isNullable()) {
        parent.implicitTrap = true;
      }
    }